

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O2

int genxScrubText(genxWriter w,constUtf8 in,utf8 out)

{
  uint uVar1;
  int iVar2;
  uchar *local_30;
  
  iVar2 = 0;
  local_30 = in;
LAB_001c9a1e:
  do {
    if (*local_30 == '\0') {
      *out = '\0';
      return iVar2;
    }
    uVar1 = genxNextUnicodeChar(&local_30);
    if ((uVar1 != 0xffffffff) && (-1 < (int)uVar1)) {
      if (uVar1 < 0x10000) {
        uVar1 = (uint)w->xmlChars[uVar1];
      }
      else {
        uVar1 = (uint)(uVar1 < 0x110000);
      }
      if (uVar1 != 0) {
        for (; in < local_30; in = in + 1) {
          *out = *in;
          out = out + 1;
        }
        goto LAB_001c9a1e;
      }
    }
    iVar2 = iVar2 + 1;
    in = local_30;
  } while( true );
}

Assistant:

int genxScrubText(genxWriter w, constUtf8 in, utf8 out)
{
  int problems = 0;
  constUtf8 last = in;

  while (*in)
  {
    int c = genxNextUnicodeChar(&in);
    if (c == -1)
    {
      problems++;
      last = in;
      continue;
    }

    if (!isXMLChar(w, c))
    {
      problems++;
      last = in;
      continue;
    }

    while (last < in)
      *out++ = *last++;
  }
  *out = 0;
  return problems;
}